

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalForcesContIntPreInt
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  void *pvVar8;
  undefined8 *puVar9;
  double *pdVar10;
  ulong uVar11;
  char *__function;
  double *pdVar12;
  long lVar13;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
  *pPVar14;
  Index inner;
  long lVar15;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
  *a_lhs;
  Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  Matrix<double,__1,__1,_0,__1,__1> *local_1528;
  Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_> local_1520;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
  *local_1518 [2];
  Scalar local_1508;
  Matrix<double,_16,_3,_1,_16,_3> local_1500;
  Matrix3xN local_1380;
  Matrix3xN local_1200;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
  local_1080 [42];
  Matrix<double,_16,_16,_1,_16,_16> local_880;
  
  CalcCoordMatrix(this,&local_1380);
  CalcCoordDerivMatrix(this,&local_1200);
  a_lhs = local_1080;
  local_1080[0].m_lhs.m_lhs.m_functor.m_other = 0.5;
  local_1080[0].m_lhs.m_rhs.m_matrix = &local_1380;
  local_1080[0].m_rhs = &local_1380;
  memset(&local_880,0,0x800);
  local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,16,3,0,16,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>const>,Eigen::Matrix<double,3,16,1,3,16>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,16,16,1,16,16>>
            (&local_880,&a_lhs->m_lhs,&local_1380,(Scalar *)&local_1500);
  if (this->m_damping_enabled == true) {
    local_1080[0].m_lhs.m_lhs.m_functor.m_other = this->m_Alpha;
    local_1080[0].m_lhs.m_rhs.m_matrix = &local_1200;
    local_1080[0].m_rhs = &local_1380;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,16,16,1,16,16>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,16,3,0,16,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>const>,Eigen::Matrix<double,3,16,1,3,16>,0>,Eigen::internal::add_assign_op<double,double>>
              (&local_880,local_1080,(add_assign_op<double,_double> *)&local_1500,(type)0x0);
  }
  local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0] = (double)&this->m_O1;
  local_1518[0] = a_lhs;
  local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [1] = (double)&local_880;
  if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != 0x100) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Map<Eigen::Matrix<double, 256, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<double, 256, 1>>, Option = 0]"
                 );
  }
  Eigen::internal::
  Assignment<Eigen::Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1518,
        (SrcXprType *)&local_1500,(assign_op<double,_double> *)&local_1528);
  if (((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows != 0x10) ||
     ((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
      .m_cols != 0x10)) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 16, 16, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 16, 16, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
  this_00 = &this->m_K13Compact;
  pdVar10 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
  if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows != 0x10) ||
     ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_cols != 0x10)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x100,0x10,0x10);
  }
  if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows == 0x10) &&
     ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_cols == 0x10)) {
    pdVar12 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
    lVar13 = 0;
    do {
      lVar15 = 0;
      pPVar14 = a_lhs;
      do {
        pdVar12[lVar15] = *(double *)&pPVar14->m_lhs - pdVar10[lVar15];
        lVar15 = lVar15 + 1;
        pPVar14 = (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
                   *)&pPVar14[2].m_lhs.field_0x20;
      } while (lVar15 != 0x10);
      lVar13 = lVar13 + 1;
      pdVar10 = pdVar10 + 0x10;
      a_lhs = (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>
               *)&(a_lhs->m_lhs).m_lhs;
      pdVar12 = pdVar12 + 0x10;
    } while (lVar13 != 0x10);
    local_1520.m_matrix = &local_1380;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [9] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [10] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0xb] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0xc] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0xd] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0xe] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0xf] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x10] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x11] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x12] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x13] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x14] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x15] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x16] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x17] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x18] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x19] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1a] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1b] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1c] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1d] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1e] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x1f] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x20] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x21] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x22] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x23] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x24] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x25] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x26] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x27] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x28] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x29] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2a] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2b] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2c] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2d] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2e] = 0.0;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
    [0x2f] = 0.0;
    local_1508 = 1.0;
    local_1528 = this_00;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,16,3,1,16,3>>(&local_1500,this_00,&local_1520,&local_1508);
    if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x30) {
      pdVar10 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if (pdVar10 != (double *)0x0) {
        free((void *)pdVar10[-1]);
      }
      pvVar8 = malloc(0x1c0);
      if (pvVar8 == (void *)0x0) {
        pdVar10 = (double *)0x0;
      }
      else {
        *(void **)(((ulong)pvVar8 & 0xffffffffffffffc0) + 0x38) = pvVar8;
        pdVar10 = (double *)(((ulong)pvVar8 & 0xffffffffffffffc0) + 0x40);
      }
      if (pdVar10 == (double *)0x0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar10;
      (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x30;
    }
    if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
        0x30) {
      pdVar10 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar11 = 0xfffffffffffffff8;
      do {
        dVar1 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 9];
        dVar2 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 10];
        dVar3 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 0xb];
        dVar4 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 0xc];
        dVar5 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 0xd];
        dVar6 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 0xe];
        dVar7 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar11 + 0xf];
        pdVar12 = pdVar10 + uVar11 + 8;
        *pdVar12 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.
                   m_storage.m_data.array[uVar11 + 8];
        pdVar12[1] = dVar1;
        pdVar12[2] = dVar2;
        pdVar12[3] = dVar3;
        pdVar12[4] = dVar4;
        pdVar12[5] = dVar5;
        pdVar12[6] = dVar6;
        pdVar12[7] = dVar7;
        uVar11 = uVar11 + 8;
      } while (uVar11 < 0x28);
      return;
    }
    __function = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 48, 1>>, T1 = double, T2 = double]"
    ;
  }
  else {
    __function = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 16, 16, 1>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
    ;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,__function);
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  This makes this method well suited for applications with many
    // discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature points
    // used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}